

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

DiffuseAreaLight *
pbrt::DiffuseAreaLight::Create
          (Transform *renderFromLight,MediumHandle *medium,ParameterDictionary *parameters,
          RGBColorSpace *colorSpace,FileLoc *loc,Allocator alloc,ShapeHandle shape)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uintptr_t iptr;
  RGBColorSpace *pRVar3;
  int iVar5;
  DiffuseAreaLight *pDVar4;
  int c;
  int iVar6;
  long lVar7;
  int x;
  ulong uVar8;
  Float FVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_00;
  bool twoSided;
  float local_3ec;
  allocator<char> local_3e6;
  allocator<char> local_3e5;
  Float scale;
  allocator<char> local_3dd;
  float local_3dc;
  SpectrumHandle L;
  RGBColorSpace *imageColorSpace;
  undefined4 local_3c4;
  Allocator alloc_local;
  undefined4 local_3b8;
  WrapMode2D local_380;
  RGBColorSpace *local_378;
  undefined8 uStack_370;
  string filename;
  ImageChannelDesc channelDesc;
  SpectrumHandle local_310;
  ColorEncodingHandle local_308;
  undefined8 local_300;
  ImageChannelDesc channelDesc_1;
  string local_2b8 [88];
  Image image;
  ImageAndMetadata im;
  undefined1 extraout_var [60];
  
  alloc_local = alloc;
  std::__cxx11::string::string<std::allocator<char>>((string *)&im,"L",(allocator<char> *)&image);
  local_300 = 0;
  ParameterDictionary::GetOneSpectrum
            ((ParameterDictionary *)&L,(string *)parameters,(SpectrumHandle *)&im,
             (SpectrumType)&local_300,(Allocator)0x2);
  std::__cxx11::string::~string((string *)&im);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&im,"scale",(allocator<char> *)&image);
  local_3ec = ParameterDictionary::GetOneFloat(parameters,(string *)&im,1.0);
  std::__cxx11::string::~string((string *)&im);
  scale = local_3ec;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&im,"twosided",(allocator<char> *)&image);
  bVar2 = ParameterDictionary::GetOneBool(parameters,(string *)&im,false);
  std::__cxx11::string::~string((string *)&im);
  twoSided = bVar2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&image,"filename",(allocator<char> *)&channelDesc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&channelDesc_1,"",(allocator<char> *)&imageColorSpace);
  ParameterDictionary::GetOneString
            ((string *)&im,parameters,(string *)&image,(string *)&channelDesc_1);
  ResolveFilename(&filename,(string *)&im);
  std::__cxx11::string::~string((string *)&im);
  std::__cxx11::string::~string((string *)&channelDesc_1);
  std::__cxx11::string::~string((string *)&image);
  Image::Image(&image,alloc);
  imageColorSpace = (RGBColorSpace *)0x0;
  if (filename._M_string_length == 0) {
    if (L.
        super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
        .bits == 0) {
      L.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
      .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
               )((ulong)&colorSpace->illuminant | 0x2000000000000);
    }
    pRVar3 = (RGBColorSpace *)0x0;
  }
  else {
    if (L.
        super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
        .bits != 0) {
      ErrorExit(loc,"Both \"L\" and \"filename\" specified for DiffuseAreaLight.");
    }
    local_308.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    Image::Read(&im,&filename,alloc,&local_308);
    std::__cxx11::string::string<std::allocator<char>>((string *)&channelDesc_1,"R",&local_3e5);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&channelDesc_1.offset.nAlloc,"G",&local_3e6);
    std::__cxx11::string::string<std::allocator<char>>(local_2b8,"B",&local_3dd);
    requestedChannels.n = 3;
    requestedChannels.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&channelDesc_1;
    Image::GetChannelDesc(&channelDesc,&im.image,requestedChannels);
    lVar7 = 0x40;
    do {
      std::__cxx11::string::~string
                ((string *)((long)&channelDesc_1.offset.alloc.memoryResource + lVar7));
      lVar7 = lVar7 + -0x20;
    } while (lVar7 != -0x20);
    if (channelDesc.offset.nStored == 0) {
      ErrorExit<std::__cxx11::string&>
                (loc,"%s: Image provided to \"diffuse\" area light must have R, G, and B channels.",
                 &filename);
    }
    Image::SelectChannels((Image *)&channelDesc_1,&im.image,&channelDesc,alloc_local);
    Image::operator=(&image,(Image *)&channelDesc_1);
    Image::~Image((Image *)&channelDesc_1);
    pRVar3 = ImageMetadata::GetColorSpace(&im.metadata);
    imageColorSpace = pRVar3;
    InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
              (&channelDesc.offset);
    ImageAndMetadata::~ImageAndMetadata(&im);
  }
  local_310.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
           )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
             )((ulong)&colorSpace->illuminant | 0x2000000000000);
  if (((ulong)L.
              super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
              .bits & 0xffffffffffff) != 0) {
    local_310.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
    .bits = L.
            super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
            .bits;
  }
  FVar9 = SpectrumToPhotometric(&local_310);
  scale = scale / FVar9;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&im,"power",(allocator<char> *)&channelDesc_1);
  local_3dc = ParameterDictionary::GetOneFloat(parameters,(string *)&im,-1.0);
  std::__cxx11::string::~string((string *)&im);
  if (0.0 < local_3dc) {
    local_378 = *(RGBColorSpace **)(pRVar3->XYZFromRGB).m[1];
    uStack_370 = *(undefined8 *)((pRVar3->XYZFromRGB).m[1] + 2);
    local_3c4 = (pRVar3->XYZFromRGB).m[1][2];
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&im,"R",(allocator<char> *)&channelDesc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&im.image.channelNames.nAlloc,"G",&local_3e5);
    std::__cxx11::string::string<std::allocator<char>>((string *)&im.image.p8.ptr,"B",&local_3e6);
    requestedChannels_00.n = 3;
    requestedChannels_00.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&im;
    Image::GetChannelDesc(&channelDesc_1,&image,requestedChannels_00);
    lVar7 = 0x40;
    do {
      std::__cxx11::string::~string((string *)((long)&im.image.format + lVar7));
      lVar7 = lVar7 + -0x20;
    } while (lVar7 != -0x20);
    if ((0 < image.resolution.super_Tuple2<pbrt::Point2,_int>.x) &&
       (0 < image.resolution.super_Tuple2<pbrt::Point2,_int>.y)) {
      auVar1._8_8_ = uStack_370;
      auVar1._0_8_ = local_378;
      auVar1 = vmovshdup_avx(auVar1);
      local_3ec = 0.0;
      iVar6 = image.resolution.super_Tuple2<pbrt::Point2,_int>.x;
      iVar5 = image.resolution.super_Tuple2<pbrt::Point2,_int>.y;
      for (lVar7 = 0; lVar7 < iVar5; lVar7 = lVar7 + 1) {
        for (uVar8 = 0; (long)uVar8 < (long)iVar6; uVar8 = uVar8 + 1) {
          iVar6 = 0;
          while (iVar6 != 3) {
            WrapMode2D::WrapMode2D(&local_380,Clamp);
            auVar10._0_4_ =
                 Image::GetChannel(&image,(Point2i)(lVar7 << 0x20 | uVar8),iVar6,local_380);
            auVar10._4_60_ = extraout_var;
            auVar11._8_8_ = uStack_370;
            auVar11._0_8_ = local_378;
            if ((iVar6 != 0) && (auVar11 = auVar1, iVar6 != 1)) {
              auVar11 = ZEXT416((uint)local_3c4);
            }
            iVar6 = iVar6 + 1;
            auVar11 = vfmadd231ss_fma(ZEXT416((uint)local_3ec),auVar10._0_16_,auVar11);
            local_3ec = auVar11._0_4_;
          }
          iVar6 = image.resolution.super_Tuple2<pbrt::Point2,_int>.x;
          iVar5 = image.resolution.super_Tuple2<pbrt::Point2,_int>.y;
        }
      }
      local_3b8 = local_3ec / (float)(iVar6 * iVar5);
    }
    local_3ec = (float)(uint)twoSided;
    FVar9 = TaggedPointer<pbrt::Sphere,pbrt::Cylinder,pbrt::Disk,pbrt::Triangle,pbrt::BilinearPatch,pbrt::Curve>
            ::Dispatch<pbrt::ShapeHandle::Area()const::_lambda(auto:1)_1_>
                      ((TaggedPointer<pbrt::Sphere,pbrt::Cylinder,pbrt::Disk,pbrt::Triangle,pbrt::BilinearPatch,pbrt::Curve>
                        *)shape.
                          super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
                          .bits);
    scale = (local_3dc /
            (FVar9 * (float)((uint)(SUB41(local_3ec,0) & 1) * 0x40000000 +
                            (uint)!(bool)(SUB41(local_3ec,0) & 1) * 0x3f800000) * 3.1415927 *
            (float)local_3b8)) * scale;
    InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
              (&channelDesc_1.offset);
  }
  pDVar4 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::DiffuseAreaLight,pbrt::Transform_const&,pbrt::MediumHandle&,pbrt::SpectrumHandle&,float&,pbrt::ShapeHandle_const&,pbrt::Image,pbrt::RGBColorSpace_const*&,bool&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     (&alloc_local,renderFromLight,medium,&L,&scale,
                      (ShapeHandle *)
                      shape.
                      super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
                      .bits,&image,&imageColorSpace,&twoSided,&alloc_local);
  Image::~Image(&image);
  std::__cxx11::string::~string((string *)&filename);
  return pDVar4;
}

Assistant:

DiffuseAreaLight *DiffuseAreaLight::Create(const Transform &renderFromLight,
                                           MediumHandle medium,
                                           const ParameterDictionary &parameters,
                                           const RGBColorSpace *colorSpace,
                                           const FileLoc *loc, Allocator alloc,
                                           const ShapeHandle shape) {
    SpectrumHandle L =
        parameters.GetOneSpectrum("L", nullptr, SpectrumType::Illuminant, alloc);
    Float scale = parameters.GetOneFloat("scale", 1);
    bool twoSided = parameters.GetOneBool("twosided", false);

    std::string filename = ResolveFilename(parameters.GetOneString("filename", ""));
    Image image(alloc);
    const RGBColorSpace *imageColorSpace = nullptr;
    if (!filename.empty()) {
        if (L != nullptr)
            ErrorExit(loc, "Both \"L\" and \"filename\" specified for DiffuseAreaLight.");
        ImageAndMetadata im = Image::Read(filename, alloc);

        ImageChannelDesc channelDesc = im.image.GetChannelDesc({"R", "G", "B"});
        if (!channelDesc)
            ErrorExit(loc,
                      "%s: Image provided to \"diffuse\" area light must have "
                      "R, G, and B channels.",
                      filename);
        image = im.image.SelectChannels(channelDesc, alloc);

        imageColorSpace = im.metadata.GetColorSpace();
    } else if (L == nullptr)
        L = &colorSpace->illuminant;

    // scale so that radiance is equivalent to 1 nit
    scale /= SpectrumToPhotometric(L ? L : &colorSpace->illuminant);

    Float phi_v = parameters.GetOneFloat("power", -1.0f);
    if (phi_v > 0) {
        // k_e is the emissive power of the light as defined by the spectral
        // distribution and texture and is used to normalize the emitted
        // radiance such that the user-defined power will be the actual power
        // emitted by the light.
        Float k_e;
        // Get the appropriate luminance vector from the image colour space
        RGB lum = imageColorSpace->LuminanceVector();
        // we need to know which channels correspond to R, G and B
        // we know that the channelDesc is valid as we would have exited in the
        // block above otherwise
        ImageChannelDesc channelDesc = image.GetChannelDesc({"R", "G", "B"});
        if (image) {
            k_e = 0;
            // Assume no distortion in the mapping, FWIW...
            for (int y = 0; y < image.Resolution().y; ++y)
                for (int x = 0; x < image.Resolution().x; ++x) {
                    for (int c = 0; c < 3; ++c)
                        k_e += image.GetChannel({x, y}, c) * lum[c];
                }
            k_e /= image.Resolution().x * image.Resolution().y;
        }

        k_e *= (twoSided ? 2 : 1) * shape.Area() * Pi;

        // now multiply up scale to hit the target power
        scale *= phi_v / k_e;
    }

    return alloc.new_object<DiffuseAreaLight>(renderFromLight, medium, L, scale, shape,
                                              std::move(image), imageColorSpace, twoSided,
                                              alloc);
}